

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_posix_file_storage.cpp
# Opt level: O0

void __thiscall
cppcms::sessions::session_file_storage::~session_file_storage(session_file_storage *this)

{
  undefined8 *in_RDI;
  vector<pthread_mutex_t,_std::allocator<pthread_mutex_t>_> *unaff_retaddr;
  uint i_1;
  uint i;
  uint in_stack_fffffffffffffff0;
  uint in_stack_fffffffffffffff4;
  
  *in_RDI = &PTR_save_00531030;
  if (in_RDI[2] == -1) {
    for (in_stack_fffffffffffffff0 = 0; in_stack_fffffffffffffff0 < *(uint *)(in_RDI + 7);
        in_stack_fffffffffffffff0 = in_stack_fffffffffffffff0 + 1) {
      std::vector<pthread_mutex_t,_std::allocator<pthread_mutex_t>_>::operator[]
                ((vector<pthread_mutex_t,_std::allocator<pthread_mutex_t>_> *)(in_RDI + 9),
                 (ulong)in_stack_fffffffffffffff0);
      cppcms::impl::destroy_mutex((pthread_mutex_t *)0x4a3cf2);
    }
  }
  else {
    for (in_stack_fffffffffffffff4 = 0; in_stack_fffffffffffffff4 < *(uint *)(in_RDI + 7);
        in_stack_fffffffffffffff4 = in_stack_fffffffffffffff4 + 1) {
      cppcms::impl::destroy_mutex((pthread_mutex_t *)0x4a3c9b);
    }
    munmap((void *)in_RDI[2],(ulong)*(uint *)(in_RDI + 7) * 0x28);
  }
  std::vector<pthread_mutex_t,_std::allocator<pthread_mutex_t>_>::~vector(unaff_retaddr);
  std::__cxx11::string::~string((string *)(in_RDI + 3));
  booster::hold_ptr<cppcms::sessions::session_file_storage::_data>::~hold_ptr
            ((hold_ptr<cppcms::sessions::session_file_storage::_data> *)
             CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  session_storage::~session_storage((session_storage *)0x4a3d35);
  return;
}

Assistant:

session_file_storage::~session_file_storage()
{
	if(memory_ !=MAP_FAILED) {
		for(unsigned i=0;i<lock_size_;i++)
			destroy_mutex(reinterpret_cast<pthread_mutex_t *>(memory_) + i);
		munmap((char*)memory_,sizeof(pthread_mutex_t) * lock_size_);
	}
	else {
		for(unsigned i=0;i<lock_size_;i++)
			destroy_mutex(&mutexes_[i]);
	}
}